

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceFile * __thiscall
cmMakefile::CreateSource(cmMakefile *this,string *sourceName,bool generated)

{
  cmSourceFile *this_00;
  cmSourceFile *sf;
  allocator local_49;
  cmSourceFile *local_48;
  string local_40;
  
  this_00 = (cmSourceFile *)operator_new(0x128);
  cmSourceFile::cmSourceFile(this_00,this,sourceName);
  local_48 = this_00;
  if (generated) {
    std::__cxx11::string::string((string *)&local_40,"GENERATED",&local_49);
    cmSourceFile::SetProperty(this_00,&local_40,"1");
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
            (&this->SourceFiles,&local_48);
  return local_48;
}

Assistant:

cmSourceFile* cmMakefile::CreateSource(const std::string& sourceName,
                                       bool generated)
{
  cmSourceFile* sf = new cmSourceFile(this, sourceName);
  if(generated)
    {
    sf->SetProperty("GENERATED", "1");
    }
  this->SourceFiles.push_back(sf);
  return sf;
}